

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool_main.cpp
# Opt level: O1

void __thiscall
UEFIToolApplication::UEFIToolApplication(UEFIToolApplication *this,int *argc,char **argv)

{
  UEFITool *this_00;
  QByteArrayView QVar1;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QArrayData *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  QArrayData *local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  
  QApplication::QApplication(&this->super_QApplication,argc,argv,0x60204);
  *(undefined ***)this = &PTR_metaObject_002b2420;
  QVar1.m_data = (storage_type *)0x8;
  QVar1.m_size = (qsizetype)&local_30;
  QString::fromUtf8(QVar1);
  local_48 = local_30;
  uStack_40 = uStack_28;
  local_38 = local_20;
  QCoreApplication::setOrganizationName((QString *)&local_48);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,8);
    }
  }
  QVar2.m_data = (storage_type *)0xb;
  QVar2.m_size = (qsizetype)&local_30;
  QString::fromUtf8(QVar2);
  local_48 = local_30;
  uStack_40 = uStack_28;
  local_38 = local_20;
  QCoreApplication::setOrganizationDomain((QString *)&local_48);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,8);
    }
  }
  QVar3.m_data = (storage_type *)0x8;
  QVar3.m_size = (qsizetype)&local_30;
  QString::fromUtf8(QVar3);
  local_48 = local_30;
  uStack_40 = uStack_28;
  local_38 = local_20;
  QCoreApplication::setApplicationName((QString *)&local_48);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,8);
    }
  }
  QVar4.m_data = (storage_type *)0x8;
  QVar4.m_size = (qsizetype)&local_30;
  QString::fromUtf8(QVar4);
  local_48 = local_30;
  uStack_40 = uStack_28;
  local_38 = local_20;
  QGuiApplication::setDesktopFileName((QString *)&local_48);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,8);
    }
  }
  this_00 = (UEFITool *)operator_new(0x100);
  UEFITool::UEFITool(this_00,(QWidget *)0x0);
  this->tool = this_00;
  return;
}

Assistant:

UEFIToolApplication(int &argc, char **argv)
    : QApplication(argc, argv)
    {
        setOrganizationName("CodeRush");
        setOrganizationDomain("coderush.me");
        setApplicationName("UEFITool");
#if QT_VERSION >= QT_VERSION_CHECK(5, 7, 0)
        setDesktopFileName("uefitool");
#endif
        tool = new UEFITool();
    }